

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O3

void __thiscall
ot::commissioner::ProxyClient::FetchMeshLocalPrefix(ProxyClient *this,ErrorHandler *aHandler)

{
  CommissionerImpl *pCVar1;
  undefined8 *puVar2;
  anon_class_40_2_1bbb15e4 onResponse;
  undefined8 *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  ProxyClient *local_40;
  _Any_data local_38;
  code *local_28;
  
  local_40 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_38,aHandler);
  pCVar1 = this->mCommissioner;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68 = (undefined8 *)0x0;
  uStack_60 = 0;
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = local_40;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)(puVar2 + 1),
             (function<void_(ot::commissioner::Error)> *)&local_38);
  pcStack_50 = std::
               _Function_handler<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/udp_proxy.cpp:189:23)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/udp_proxy.cpp:189:23)>
             ::_M_manager;
  local_68 = puVar2;
  (*(pCVar1->super_Commissioner)._vptr_Commissioner[0x19])(pCVar1,&local_68,0x800);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void ProxyClient::FetchMeshLocalPrefix(Commissioner::ErrorHandler aHandler)
{
    auto onResponse = [=](const ActiveOperationalDataset *aActiveDataset, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        ASSERT(aActiveDataset != nullptr);

        VerifyOrExit(aActiveDataset->mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit,
                     error = ERROR_BAD_FORMAT("Mesh-Local prefix not included in response"));
        SuccessOrExit(error = SetMeshLocalPrefix(aActiveDataset->mMeshLocalPrefix));

    exit:
        aHandler(aError);
    };

    mCommissioner.GetActiveDataset(onResponse, ActiveOperationalDataset::kMeshLocalPrefixBit);
}